

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::pipeline::anon_unknown_0::ComputeCacheTestInstance::verifyTestResult
          (TestStatus *__return_storage_ptr__,ComputeCacheTestInstance *this)

{
  char *pcVar1;
  char *pcVar2;
  Allocation *pAVar3;
  DeviceInterface *vkd;
  VkDevice device;
  long lVar4;
  allocator<char> local_41;
  string local_40;
  
  vkd = Context::getDeviceInterface((this->super_CacheTestInstance).super_TestInstance.m_context);
  device = Context::getDevice((this->super_CacheTestInstance).super_TestInstance.m_context);
  pAVar3 = this->m_outputBufferAlloc[0].
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::invalidateMappedMemoryRange
            (vkd,device,(VkDeviceMemory)(pAVar3->m_memory).m_internal,pAVar3->m_offset,0x800);
  pAVar3 = this->m_outputBufferAlloc[1].
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::invalidateMappedMemoryRange
            (vkd,device,(VkDeviceMemory)(pAVar3->m_memory).m_internal,pAVar3->m_offset,0x800);
  lVar4 = 0;
  do {
    if (lVar4 == 0x800) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"Output buffers w/o cached pipeline match.",&local_41);
      tcu::TestStatus::pass(__return_storage_ptr__,&local_40);
      goto LAB_004e8e2d;
    }
    pcVar1 = (char *)((long)(this->m_outputBufferAlloc[0].
                             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                             m_data.ptr)->m_hostPtr + lVar4);
    pcVar2 = (char *)((long)(this->m_outputBufferAlloc[1].
                             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                             m_data.ptr)->m_hostPtr + lVar4);
    lVar4 = lVar4 + 1;
  } while (*pcVar1 == *pcVar2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Output buffers w/o cached pipeline mismatch.",&local_41);
  tcu::TestStatus::fail(__return_storage_ptr__,&local_40);
LAB_004e8e2d:
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus ComputeCacheTestInstance::verifyTestResult (void)
{
	const DeviceInterface&  vk               = m_context.getDeviceInterface();
	const VkDevice          vkDevice         = m_context.getDevice();

	// Read the content of output buffers
	invalidateMappedMemoryRange(vk,
								vkDevice,
								m_outputBufferAlloc[PIPELINE_CACHE_NDX_NO_CACHE]->getMemory(),
								m_outputBufferAlloc[PIPELINE_CACHE_NDX_NO_CACHE]->getOffset(),
								sizeof(tcu::Vec4) * 128u);

	invalidateMappedMemoryRange(vk,
								vkDevice,
								m_outputBufferAlloc[PIPELINE_CACHE_NDX_CACHED]->getMemory(),
								m_outputBufferAlloc[PIPELINE_CACHE_NDX_CACHED]->getOffset(),
								sizeof(tcu::Vec4) * 128u);
	// Compare the content
	deUint8* bufNoCache = reinterpret_cast<deUint8*>(m_outputBufferAlloc[PIPELINE_CACHE_NDX_NO_CACHE]->getHostPtr());
	deUint8* bufCached  = reinterpret_cast<deUint8*>(m_outputBufferAlloc[PIPELINE_CACHE_NDX_CACHED]->getHostPtr());
	for (deUint32 ndx = 0u; ndx < sizeof(tcu::Vec4) * 128u; ndx++)
	{
		if (bufNoCache[ndx] != bufCached[ndx])
		{
			return tcu::TestStatus::fail("Output buffers w/o cached pipeline mismatch.");
		}
	}

	return tcu::TestStatus::pass("Output buffers w/o cached pipeline match.");
}